

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_key.h
# Opt level: O0

string * __thiscall cppcms::string_key::str_abi_cxx11_(string_key *this)

{
  char *pcVar1;
  long lVar2;
  long *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 2));
  }
  else {
    pcVar1 = (char *)*in_RSI;
    lVar2 = in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,lVar2 - (long)pcVar1,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

std::string str() const
		{
			if(begin_)
				return std::string(begin_,end_-begin_);
			else
				return key_;
		}